

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_harbor.c
# Opt level: O0

keyvalue * hash_search(hashmap *hash,char *name)

{
  uint uVar1;
  int iVar2;
  keyvalue *local_38;
  keyvalue *node;
  uint32_t h;
  uint32_t *ptr;
  char *name_local;
  hashmap *hash_local;
  
  uVar1 = *(uint *)name ^ *(uint *)(name + 4) ^ *(uint *)(name + 8) ^ *(uint *)(name + 0xc);
  local_38 = hash->node[uVar1 & 0xfff];
  while( true ) {
    if (local_38 == (keyvalue *)0x0) {
      return (keyvalue *)0x0;
    }
    if ((local_38->hash == uVar1) && (iVar2 = strncmp(local_38->key,name,0x10), iVar2 == 0)) break;
    local_38 = local_38->next;
  }
  return local_38;
}

Assistant:

static struct keyvalue *
hash_search(struct hashmap * hash, const char name[GLOBALNAME_LENGTH]) {
	uint32_t *ptr = (uint32_t*) name;
	uint32_t h = ptr[0] ^ ptr[1] ^ ptr[2] ^ ptr[3];
	struct keyvalue * node = hash->node[h % HASH_SIZE];
	while (node) {
		if (node->hash == h && strncmp(node->key, name, GLOBALNAME_LENGTH) == 0) {
			return node;
		}
		node = node->next;
	}
	return NULL;
}